

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fld_def.c
# Opt level: O1

FIELD * new_field(int rows,int cols,int frow,int fcol,int nrow,int nbuf)

{
  short sVar1;
  short sVar2;
  short sVar3;
  _Bool _Var4;
  int iVar5;
  FIELD *dst;
  char *__s;
  int *piVar6;
  long lVar7;
  FIELD *pFVar8;
  FIELD *pFVar9;
  size_t __size;
  byte bVar10;
  
  bVar10 = 0;
  dst = (FIELD *)0x0;
  iVar5 = -2;
  if (((0 < rows) && (0 < cols)) && (-1 < (nrow | nbuf | fcol | frow))) {
    dst = (FIELD *)malloc(0x78);
    iVar5 = -1;
    if (dst == (FIELD *)0x0) {
      dst = (FIELD *)0x0;
    }
    else {
      pFVar8 = &default_field;
      pFVar9 = dst;
      for (lVar7 = 0xf; lVar7 != 0; lVar7 = lVar7 + -1) {
        sVar1 = pFVar8->rows;
        sVar2 = pFVar8->cols;
        sVar3 = pFVar8->frow;
        pFVar9->status = pFVar8->status;
        pFVar9->rows = sVar1;
        pFVar9->cols = sVar2;
        pFVar9->frow = sVar3;
        pFVar8 = (FIELD *)((long)pFVar8 + ((ulong)bVar10 * -2 + 1) * 8);
        pFVar9 = (FIELD *)((long)pFVar9 + (ulong)bVar10 * -0x10 + 8);
      }
      dst->rows = (short)rows;
      dst->cols = (short)cols;
      dst->drows = rows + nrow;
      dst->dcols = cols;
      dst->frow = (short)frow;
      dst->fcol = (short)fcol;
      dst->nrow = nrow;
      dst->nbuf = (short)nbuf;
      dst->link = dst;
      _Var4 = _nc_Copy_Type(dst,&default_field);
      if (_Var4) {
        __size = ((long)dst->nbuf + 1) * ((long)dst->dcols * (long)dst->drows + 1);
        __s = (char *)malloc(__size);
        dst->buf = __s;
        if (__s != (char *)0x0) {
          memset(__s,0x20,__size);
          if (dst->nbuf < 0) {
            return dst;
          }
          iVar5 = -1;
          do {
            dst->buf[(long)((iVar5 + 2) * ((int)dst->cols * dst->drows + 1)) + -1] = '\0';
            iVar5 = iVar5 + 1;
          } while (iVar5 < dst->nbuf);
          return dst;
        }
      }
      iVar5 = -1;
    }
  }
  if (dst != (FIELD *)0x0) {
    free_field(dst);
  }
  piVar6 = __errno_location();
  *piVar6 = iVar5;
  return (FIELD *)0x0;
}

Assistant:

FIELD *new_field(int rows, int cols, int frow, int fcol, int nrow, int nbuf)
{
  FIELD *New_Field = (FIELD *)0;
  int err = E_BAD_ARGUMENT;

  if (rows>0  && 
      cols>0  && 
      frow>=0 && 
      fcol>=0 && 
      nrow>=0 && 
      nbuf>=0 &&
      ((err = E_SYSTEM_ERROR) != 0) && /* trick: this resets the default error */
      (New_Field=(FIELD *)malloc(sizeof(FIELD))) )
    {
      *New_Field       = default_field;
      New_Field->rows  = rows;
      New_Field->cols  = cols;
      New_Field->drows = rows + nrow;
      New_Field->dcols = cols;
      New_Field->frow  = frow;
      New_Field->fcol  = fcol;
      New_Field->nrow  = nrow;
      New_Field->nbuf  = nbuf;
      New_Field->link  = New_Field;

      if (_nc_Copy_Type(New_Field,&default_field))
	{
	  size_t len;

	  len = Total_Buffer_Size(New_Field);
	  if ((New_Field->buf = (char *)malloc(len)))
	    {
	      /* Prefill buffers with blanks and insert terminating zeroes
		 between buffers */
	      int i;

	      memset(New_Field->buf,' ',len);
	      for(i=0;i<=New_Field->nbuf;i++)
		{
		  New_Field->buf[(New_Field->drows*New_Field->cols+1)*(i+1)-1]
		    = '\0';
		}
	      return New_Field;
	    }
	}
    }

  if (New_Field) 
    free_field(New_Field);
  
  SET_ERROR( err );
  return (FIELD *)0;
}